

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Empty.hpp
# Opt level: O1

string * __thiscall
ut11::Operands::IsEmpty::GetErrorMessage<std::__cxx11::string>
          (string *__return_storage_ptr__,IsEmpty *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  pointer pcVar1;
  stringstream errorMessage;
  char *local_1c8;
  long local_1c0;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Expected empty but was ",0x17);
  pcVar1 = (actual->_M_dataplus)._M_p;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + actual->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,local_1c8,local_1c0);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetErrorMessage(const U& actual) const
			{
				std::stringstream errorMessage;
				errorMessage << "Expected empty but was " << utility::ToString(actual);
				return errorMessage.str();
			}